

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O2

string * Imf_3_4::channelInOtherView
                   (string *__return_storage_ptr__,string *channelName,ChannelList *channelList,
                   StringVector *multiView,string *otherViewName)

{
  string *psVar1;
  __type _Var2;
  bool bVar3;
  const_iterator cVar4;
  ConstIterator CVar5;
  _Base_ptr __s;
  allocator<char> local_b2;
  allocator<char> local_b1;
  string *local_b0;
  string *local_a8;
  string *local_a0;
  ChannelList *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0 = __return_storage_ptr__;
  local_a8 = channelName;
  local_a0 = otherViewName;
  local_98 = channelList;
  cVar4._M_node = (_Base_ptr)ChannelList::begin(channelList);
  for (; CVar5 = ChannelList::end(local_98), (const_iterator)cVar4._M_node != CVar5._i._M_node;
      cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node)) {
    __s = cVar4._M_node + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,(char *)__s,&local_b1);
    viewFromChannelName(&local_70,&local_90,multiView);
    _Var2 = std::operator==(&local_70,local_a0);
    if (_Var2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,(char *)__s,&local_b2);
      bVar3 = areCounterparts(&local_50,local_a8,multiView);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar3) goto LAB_0018ef4b;
    }
    else {
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  __s = (_Base_ptr)0x1ae3db;
LAB_0018ef4b:
  psVar1 = local_b0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,(char *)__s,(allocator<char> *)&local_70);
  return psVar1;
}

Assistant:

string
channelInOtherView (
    const string&       channelName,
    const ChannelList&  channelList,
    const StringVector& multiView,
    const string&       otherViewName)
{
    //
    // Given the name of a channel in one view, return the
    // corresponding channel name for view otherViewName.
    //

    for (ChannelList::ConstIterator i = channelList.begin ();
         i != channelList.end ();
         ++i)
    {
        if (viewFromChannelName (i.name (), multiView) == otherViewName &&
            areCounterparts (i.name (), channelName, multiView))
        {
            return i.name ();
        }
    }

    return "";
}